

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

CService * GetLocalAddress(CService *__return_storage_ptr__,CNode *peer)

{
  _Base_ptr this;
  _Rb_tree_color _Var1;
  size_type sVar2;
  char *pcVar3;
  undefined8 uVar4;
  char cVar5;
  uint16_t uVar6;
  Network NVar7;
  Network NVar8;
  int iVar9;
  _Base_ptr p_Var10;
  int iVar11;
  direct_or_indirect *pdVar12;
  long in_FS_OFFSET;
  UniqueLock<GlobalMutex> criticalblock16;
  _Rb_tree_color local_d4;
  CNetAddr local_b8;
  direct_or_indirect local_98;
  uint local_88;
  undefined8 local_80;
  undefined2 local_78;
  char local_70;
  direct_or_indirect local_60;
  uint local_50;
  undefined8 local_48;
  undefined2 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_70 = '\0';
  if (fListen) {
    local_b8.m_addr._union.indirect_contents.indirect = (char *)&g_maplocalhost_mutex;
    local_b8.m_addr._union.direct[8] = '\0';
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_b8);
    if ((_Rb_tree_header *)mapLocalHost._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &mapLocalHost._M_t._M_impl.super__Rb_tree_header) {
      local_d4 = ~_S_red;
      iVar11 = -1;
      p_Var10 = mapLocalHost._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        this = p_Var10 + 1;
        NVar7 = CNetAddr::GetNetwork((CNetAddr *)this);
        NVar8 = NET_ONION;
        if (peer->m_inbound_onion == false) {
          NVar8 = CNetAddr::GetNetClass((CNetAddr *)&peer->addr);
        }
        if ((NVar7 == NVar8) ||
           (((1 < *(int *)&p_Var10[1]._M_right - 3U && (peer->m_inbound_onion == false)) &&
            (1 < (peer->addr).super_CService.super_CNetAddr.m_net - NET_ONION)))) {
          _Var1 = p_Var10[2]._M_color;
          iVar9 = CNetAddr::GetReachabilityFrom((CNetAddr *)this,(CNetAddr *)&peer->addr);
          if ((iVar11 < iVar9) || ((iVar9 == iVar11 && ((int)local_d4 < (int)_Var1)))) {
            CService::CService((CService *)&local_60.indirect_contents,(CNetAddr *)this,
                               *(uint16_t *)&p_Var10[2].field_0x4);
            if ((local_70 == '\x01') && (0x10 < local_88)) {
              free(local_98.indirect_contents.indirect);
            }
            local_98.indirect_contents.indirect = local_60.indirect_contents.indirect;
            local_98._8_8_ = local_60._8_8_;
            local_88 = local_50;
            local_80 = local_48;
            local_78 = local_40;
            local_70 = '\x01';
            iVar11 = iVar9;
            local_d4 = _Var1;
          }
        }
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != &mapLocalHost._M_t._M_impl.super__Rb_tree_header);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_b8);
  }
  CNetAddr::CNetAddr(&local_b8);
  uVar6 = GetListenPort();
  CService::CService((CService *)&local_60.indirect_contents,&local_b8,uVar6);
  cVar5 = local_70;
  pdVar12 = &local_60;
  if (local_70 != '\0') {
    pdVar12 = &local_98;
  }
  uVar4 = *(undefined8 *)&(pdVar12->indirect_contents).capacity;
  (__return_storage_ptr__->super_CNetAddr).m_addr._union.indirect_contents.indirect =
       (((CNetAddr *)&(pdVar12->indirect_contents).indirect)->m_addr)._union.indirect_contents.
       indirect;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CNetAddr).m_addr._union + 8) = uVar4;
  sVar2 = *(size_type *)((long)&(&pdVar12->indirect_contents)[1].indirect + 4);
  *(size_type *)((long)&(&pdVar12->indirect_contents)[1].indirect + 4) = 0;
  uVar6 = *(uint16_t *)(pdVar12->direct + 0x20);
  pcVar3 = (&pdVar12->indirect_contents)[2].indirect;
  (__return_storage_ptr__->super_CNetAddr).m_addr._size = sVar2;
  *(char **)&(__return_storage_ptr__->super_CNetAddr).m_net = pcVar3;
  __return_storage_ptr__->port = uVar6;
  if (0x10 < local_50) {
    free(local_60.indirect_contents.indirect);
    local_60.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_b8.m_addr._size) {
    free(local_b8.m_addr._union.indirect_contents.indirect);
  }
  if ((cVar5 != '\0') && (0x10 < local_88)) {
    free(local_98.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

CService GetLocalAddress(const CNode& peer)
{
    return GetLocal(peer).value_or(CService{CNetAddr(), GetListenPort()});
}